

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O2

void * __thiscall Centaurus::Stage1Runner::acquire_bank(Stage1Runner *this)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  ulong in_RAX;
  long lVar4;
  ulong uStack_38;
  WindowBankState old_state;
  
  pvVar1 = (this->super_BaseRunner).m_sub_window;
  lVar2 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    do {
      lVar4 = lVar2;
      lVar2 = 0;
    } while ((this->super_BaseRunner).m_bank_num <= lVar4);
    uStack_38 = uStack_38 & 0xffffffff;
    bVar3 = std::atomic<Centaurus::BaseRunner::WindowBankState>::compare_exchange_weak
                      ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                       ((long)pvVar1 + lVar4 * 8 + 4),&old_state,Stage1_Locked,memory_order_seq_cst)
    ;
    if (bVar3) break;
    lVar2 = lVar4 + 1;
  }
  this->m_current_bank = (int)lVar4;
  return (void *)(lVar4 * (this->super_BaseRunner).m_bank_size +
                 (long)(this->super_BaseRunner).m_main_window);
}

Assistant:

void *acquire_bank()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Free;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage1_Locked)) {
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        }
      }
    }
  }